

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getticks.c
# Opt level: O2

unsigned_long getticks(void)

{
  int iVar1;
  long lVar2;
  timespec ts;
  
  iVar1 = clock_gettime(1,(timespec *)&ts);
  if (iVar1 == 0) {
    lVar2 = 1000000;
  }
  else {
    gettimeofday((timeval *)&ts,(__timezone_ptr_t)0x0);
    lVar2 = 1000;
  }
  return ts.tv_nsec / lVar2 + ts.tv_sec * 1000;
}

Assistant:

unsigned long getticks(void)
{
    /*
     * We want to use milliseconds rather than the microseconds or
     * nanoseconds given by the underlying clock functions, because we
     * need a decent number of them to fit into a 32-bit word so it
     * can be used for keepalives.
     */
#if HAVE_CLOCK_GETTIME && HAVE_CLOCK_MONOTONIC
    {
        /* Use CLOCK_MONOTONIC if available, so as to be unconfused if
         * the system clock changes. */
        struct timespec ts;
        if (clock_gettime(CLOCK_MONOTONIC, &ts) == 0)
            return ts.tv_sec * TICKSPERSEC +
                ts.tv_nsec / (1000000000 / TICKSPERSEC);
    }
#endif
    {
        struct timeval tv;
        gettimeofday(&tv, NULL);
        return tv.tv_sec * TICKSPERSEC + tv.tv_usec / (1000000 / TICKSPERSEC);
    }
}